

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit_run_policy.h
# Opt level: O2

void __thiscall bandit::detail::bandit_run_policy::~bandit_run_policy(bandit_run_policy *this)

{
  ~bandit_run_policy(this);
  operator_delete(this);
  return;
}

Assistant:

bandit_run_policy(const char* skip_pattern, const char* only_pattern, bool break_on_failure, bool dry_run)
      : run_policy(), skip_pattern_(skip_pattern), only_pattern_(only_pattern),
      break_on_failure_(break_on_failure), dry_run_(dry_run)
    {}